

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

void node::RegenerateCommitments(CBlock *block,ChainstateManager *chainman)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar5 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  CBlockIndex *pindexPrev;
  undefined8 uVar7;
  size_type *psVar8;
  long lVar9;
  vector<CTxOut,_std::allocator<CTxOut>_> *unaff_RBX;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  CMutableTransaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  CMutableTransaction local_88;
  undefined1 local_49;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  uchar local_38 [8];
  uchar auStack_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0096cd38;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    CMutableTransaction::CMutableTransaction
              (&local_88,
               (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    unaff_RBX = &local_88.vout;
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = -1;
    if (psVar1 != (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      peVar2 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3;
      if (lVar10 != 0) {
        lVar9 = (lVar10 >> 3) * -0x3333333333333333;
        psVar8 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
        uVar11 = 0xffffffff;
        uVar12 = 0;
        do {
          if ((((0x42 < *psVar8) &&
               (pcVar4 = *(char **)&((CScriptBase *)(psVar8 + -7))->_union, *pcVar4 == 'j')) &&
              (pcVar4[1] == '$')) &&
             (((pcVar4[2] == -0x56 && (pcVar4[3] == '!')) &&
              ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))))) {
            uVar11 = uVar12 & 0xffffffff;
          }
          uVar12 = uVar12 + 1;
          psVar8 = psVar8 + 10;
        } while (lVar9 + (ulong)(lVar9 == 0) != uVar12);
        lVar9 = (long)(int)uVar11;
      }
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase
              (unaff_RBX,
               local_88.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start + lVar9);
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              (&_Stack_40,(CTransaction **)local_48,(allocator<CTransaction> *)&local_49,&local_88);
    _Var6._M_pi = _Stack_40._M_pi;
    auVar5 = local_48;
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
      local_48 = (undefined1  [8])0x0;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)auVar5;
      (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Var6._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
      local_48 = (undefined1  [8])&cs_main;
      _Stack_40._M_pi = _Stack_40._M_pi & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_48);
      pindexPrev = BlockManager::LookupBlockIndex
                             (&chainman->m_blockman,&(block->super_CBlockHeader).hashPrevBlock);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_48);
      ChainstateManager::GenerateCoinbaseCommitment(&local_a0,chainman,block,pindexPrev);
      if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      BlockMerkleRoot((uint256 *)local_48,block,(bool *)0x0);
      *(uchar (*) [8])
       ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_38;
      *(uchar (*) [8])
       ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
           auStack_30;
      *(undefined1 (*) [8])
       (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems = local_48;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
           _Stack_40._M_pi;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(unaff_RBX);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_88.vin);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
      goto LAB_0096cd38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar7 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(unaff_RBX);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_88.vin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      _Unwind_Resume(uVar7);
    }
  }
LAB_0096cd38:
  __stack_chk_fail();
}

Assistant:

void RegenerateCommitments(CBlock& block, ChainstateManager& chainman)
{
    CMutableTransaction tx{*block.vtx.at(0)};
    tx.vout.erase(tx.vout.begin() + GetWitnessCommitmentIndex(block));
    block.vtx.at(0) = MakeTransactionRef(tx);

    const CBlockIndex* prev_block = WITH_LOCK(::cs_main, return chainman.m_blockman.LookupBlockIndex(block.hashPrevBlock));
    chainman.GenerateCoinbaseCommitment(block, prev_block);

    block.hashMerkleRoot = BlockMerkleRoot(block);
}